

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

wchar_t bid_keyword_list(char *p,ssize_t len,wchar_t unset,wchar_t last_is_path)

{
  wchar_t wVar1;
  bool bVar2;
  bool bVar3;
  wchar_t value;
  wchar_t blank;
  wchar_t keycnt;
  wchar_t l;
  wchar_t last_is_path_local;
  wchar_t unset_local;
  ssize_t len_local;
  char *p_local;
  
  value = L'\0';
  _last_is_path_local = len;
  len_local = (ssize_t)p;
  while( true ) {
    bVar2 = false;
    if (0 < _last_is_path_local) {
      bVar2 = *(char *)len_local != '\0';
    }
    if (!bVar2) {
      return value;
    }
    bVar2 = false;
    while( true ) {
      bVar3 = false;
      if ((0 < _last_is_path_local) && (bVar3 = true, *(char *)len_local != ' ')) {
        bVar3 = *(char *)len_local == '\t';
      }
      if (!bVar3) break;
      len_local = len_local + 1;
      _last_is_path_local = _last_is_path_local + -1;
      bVar2 = true;
    }
    if (*(char *)len_local == '\n') {
      return value;
    }
    if (*(char *)len_local == '\r') {
      return value;
    }
    if (*(char *)len_local == '\\') {
      if (*(char *)(len_local + 1) == '\n') {
        return value;
      }
      if (*(char *)(len_local + 1) == '\r') {
        return value;
      }
    }
    if ((!bVar2) && (last_is_path == L'\0')) {
      return L'\xffffffff';
    }
    if ((last_is_path != L'\0') && (_last_is_path_local == 0)) break;
    if ((unset != L'\0') &&
       (wVar1 = bid_keycmp((char *)len_local,"all",_last_is_path_local), L'\0' < wVar1)) {
      return L'\x01';
    }
    wVar1 = bid_keyword((char *)len_local,_last_is_path_local);
    if (wVar1 == L'\0') {
      return L'\xffffffff';
    }
    len_local = len_local + wVar1;
    _last_is_path_local = _last_is_path_local - wVar1;
    value = value + L'\x01';
    if (*(char *)len_local == '=') {
      bVar2 = false;
      while( true ) {
        len_local = len_local + 1;
        _last_is_path_local = _last_is_path_local + -1;
        bVar3 = false;
        if ((0 < _last_is_path_local) && (bVar3 = false, *(char *)len_local != ' ')) {
          bVar3 = *(char *)len_local != '\t';
        }
        if (!bVar3) break;
        bVar2 = true;
      }
      if ((unset == L'\0') && (!bVar2)) {
        return L'\xffffffff';
      }
    }
  }
  return value;
}

Assistant:

static int
bid_keyword_list(const char *p,  ssize_t len, int unset, int last_is_path)
{
	int l;
	int keycnt = 0;

	while (len > 0 && *p) {
		int blank = 0;

		/* Test whether there are blank characters in the line. */
		while (len >0 && (*p == ' ' || *p == '\t')) {
			++p;
			--len;
			blank = 1;
		}
		if (*p == '\n' || *p == '\r')
			break;
		if (p[0] == '\\' && (p[1] == '\n' || p[1] == '\r'))
			break;
		if (!blank && !last_is_path) /* No blank character. */
			return (-1);
		if (last_is_path && len == 0)
				return (keycnt);

		if (unset) {
			l = bid_keycmp(p, "all", len);
			if (l > 0)
				return (1);
		}
		/* Test whether there is a correct key in the line. */
		l = bid_keyword(p, len);
		if (l == 0)
			return (-1);/* Unknown keyword was found. */
		p += l;
		len -= l;
		keycnt++;

		/* Skip value */
		if (*p == '=') {
			int value = 0;
			++p;
			--len;
			while (len > 0 && *p != ' ' && *p != '\t') {
				++p;
				--len;
				value = 1;
			}
			/* A keyword should have a its value unless
			 * "/unset" operation. */ 
			if (!unset && value == 0)
				return (-1);
		}
	}
	return (keycnt);
}